

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.h
# Opt level: O0

void __thiscall
btTranslationalLimitMotor2::btTranslationalLimitMotor2(btTranslationalLimitMotor2 *this)

{
  btScalar *pbVar1;
  btVector3 *in_RDI;
  int i;
  int local_84;
  btScalar local_80;
  btScalar local_7c;
  btScalar local_78;
  btScalar local_74;
  btScalar local_70;
  btScalar local_6c;
  btScalar local_68;
  btScalar local_64;
  btScalar local_60;
  btScalar local_5c;
  btScalar local_58;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btScalar local_2c;
  btScalar local_28;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c;
  btScalar local_18;
  btScalar local_14;
  btScalar local_10;
  btScalar local_c [3];
  
  btVector3::btVector3(in_RDI);
  btVector3::btVector3(in_RDI + 1);
  btVector3::btVector3(in_RDI + 2);
  btVector3::btVector3(in_RDI + 3);
  btVector3::btVector3(in_RDI + 4);
  btVector3::btVector3(in_RDI + 5);
  btVector3::btVector3(in_RDI + 6);
  btVector3::btVector3((btVector3 *)(in_RDI[7].m_floats + 3));
  btVector3::btVector3((btVector3 *)(in_RDI[8].m_floats + 3));
  btVector3::btVector3(in_RDI + 10);
  btVector3::btVector3((btVector3 *)(in_RDI[0xb].m_floats + 1));
  btVector3::btVector3((btVector3 *)(in_RDI[0xc].m_floats + 1));
  btVector3::btVector3((btVector3 *)(in_RDI[0xd].m_floats + 1));
  btVector3::btVector3((btVector3 *)(in_RDI[0xe].m_floats + 1));
  btVector3::btVector3((btVector3 *)(in_RDI[0xf].m_floats + 1));
  btVector3::btVector3((btVector3 *)(in_RDI[0x10].m_floats + 1));
  local_c[0] = 0.0;
  local_10 = 0.0;
  local_14 = 0.0;
  btVector3::setValue(in_RDI,local_c,&local_10,&local_14);
  local_18 = 0.0;
  local_1c = 0.0;
  local_20 = 0.0;
  btVector3::setValue(in_RDI + 1,&local_18,&local_1c,&local_20);
  local_24 = 0.0;
  local_28 = 0.0;
  local_2c = 0.0;
  btVector3::setValue(in_RDI + 2,&local_24,&local_28,&local_2c);
  local_30 = 0.2;
  local_34 = 0.2;
  local_38 = 0.2;
  btVector3::setValue(in_RDI + 3,&local_30,&local_34,&local_38);
  local_3c = 0.0;
  local_40 = 0.0;
  local_44 = 0.0;
  btVector3::setValue(in_RDI + 4,&local_3c,&local_40,&local_44);
  local_48 = 0.9;
  local_4c = 0.9;
  local_50 = 0.9;
  btVector3::setValue(in_RDI + 5,&local_48,&local_4c,&local_50);
  local_54 = 0.0;
  local_58 = 0.0;
  local_5c = 0.0;
  btVector3::setValue(in_RDI + 6,&local_54,&local_58,&local_5c);
  local_60 = 0.0;
  local_64 = 0.0;
  local_68 = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI[0xe].m_floats + 1),&local_60,&local_64,&local_68);
  local_6c = 0.0;
  local_70 = 0.0;
  local_74 = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI[0xf].m_floats + 1),&local_6c,&local_70,&local_74);
  local_78 = 0.0;
  local_7c = 0.0;
  local_80 = 0.0;
  btVector3::setValue((btVector3 *)(in_RDI[0x10].m_floats + 1),&local_78,&local_7c,&local_80);
  for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
    *(undefined1 *)((long)in_RDI[7].m_floats + (long)local_84) = 0;
    *(undefined1 *)((long)in_RDI[7].m_floats + (long)local_84 + 3) = 0;
    *(undefined1 *)((long)in_RDI[7].m_floats + (long)local_84 + 6) = 0;
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[7].m_floats + 3));
    pbVar1[local_84] = 0.0;
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[8].m_floats + 3));
    pbVar1[local_84] = 0.0;
    *(undefined1 *)((long)in_RDI[9].m_floats + (long)local_84 + 0xc) = 0;
    pbVar1 = btVector3::operator_cast_to_float_(in_RDI + 10);
    pbVar1[local_84] = 0.0;
    *(undefined1 *)((long)in_RDI[0xb].m_floats + (long)local_84) = 0;
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[0xb].m_floats + 1));
    pbVar1[local_84] = 0.0;
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[0xc].m_floats + 1));
    pbVar1[local_84] = 0.0;
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[0xd].m_floats + 1));
    pbVar1[local_84] = 0.0;
    in_RDI[0x11].m_floats[(long)local_84 + 1] = 0.0;
  }
  return;
}

Assistant:

btTranslationalLimitMotor2()
	{
		m_lowerLimit         .setValue(0.f , 0.f , 0.f );
		m_upperLimit         .setValue(0.f , 0.f , 0.f );
		m_bounce             .setValue(0.f , 0.f , 0.f );
		m_stopERP            .setValue(0.2f, 0.2f, 0.2f);
		m_stopCFM            .setValue(0.f , 0.f , 0.f );
		m_motorERP           .setValue(0.9f, 0.9f, 0.9f);
		m_motorCFM           .setValue(0.f , 0.f , 0.f );

		m_currentLimitError  .setValue(0.f , 0.f , 0.f );
		m_currentLimitErrorHi.setValue(0.f , 0.f , 0.f );
		m_currentLinearDiff  .setValue(0.f , 0.f , 0.f );

		for(int i=0; i < 3; i++) 
		{
			m_enableMotor[i]            = false;
			m_servoMotor[i]             = false;
			m_enableSpring[i]           = false;
			m_servoTarget[i]            = btScalar(0.f);
			m_springStiffness[i]        = btScalar(0.f);
			m_springStiffnessLimited[i] = false;
			m_springDamping[i]          = btScalar(0.f);
			m_springDampingLimited[i]   = false;
			m_equilibriumPoint[i]       = btScalar(0.f);
			m_targetVelocity[i]         = btScalar(0.f);
			m_maxMotorForce[i]          = btScalar(0.f);
			
			m_currentLimit[i]     = 0;
		}
	}